

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int parse_http_headers(char **buf,mg_header *hdr)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar4 = *buf;
  lVar1 = 0;
  do {
    pcVar2 = pcVar4 + -1;
    lVar6 = 1;
    pcVar5 = pcVar4;
    do {
      pcVar5 = pcVar5 + 1;
      cVar3 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
      lVar6 = lVar6 + -1;
      if (cVar3 == ':') break;
    } while (0xa1 < (byte)(cVar3 + 0x81U));
    if (lVar6 == 0) goto LAB_0010c39d;
    while (cVar3 == ' ') {
      *pcVar2 = '\0';
      pcVar4 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
      pcVar5 = pcVar5 + 1;
      cVar3 = *pcVar4;
    }
    if (cVar3 != ':') {
LAB_0010c398:
      lVar1 = 0xffffffff;
LAB_0010c39d:
      return (int)lVar1;
    }
    *pcVar2 = '\0';
    hdr[lVar1].name = *buf;
    for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
    }
    hdr[lVar1].value = pcVar5;
    while( true ) {
      cVar3 = *pcVar5;
      if (cVar3 == '\0') {
        *buf = pcVar5;
        return (int)lVar1 + 1;
      }
      if (cVar3 == '\n') goto LAB_0010c371;
      if (cVar3 == '\r') break;
      pcVar5 = pcVar5 + 1;
    }
    *pcVar5 = '\0';
    if (pcVar5[1] != '\n') goto LAB_0010c398;
    pcVar5 = pcVar5 + 1;
LAB_0010c371:
    lVar1 = lVar1 + 1;
    *pcVar5 = '\0';
    pcVar4 = pcVar5 + 1;
    *buf = pcVar4;
    if (((pcVar5[1] == '\n') || (pcVar5[1] == '\r')) || (lVar1 == 0x40)) goto LAB_0010c39d;
  } while( true );
}

Assistant:

static int
parse_http_headers(char **buf, struct mg_header hdr[MG_MAX_HEADERS])
{
	int i;
	int num_headers = 0;

	for (i = 0; i < (int)MG_MAX_HEADERS; i++) {
		char *dp = *buf;

		/* Skip all ASCII characters (>SPACE, <127), to find a ':' */
		while ((*dp != ':') && (*dp >= 33) && (*dp <= 126)) {
			dp++;
		}
		if (dp == *buf) {
			/* End of headers reached. */
			break;
		}

		/* Drop all spaces after header name before : */
		while (*dp == ' ') {
			*dp = 0;
			dp++;
		}
		if (*dp != ':') {
			/* This is not a valid field. */
			return -1;
		}

		/* End of header key (*dp == ':') */
		/* Truncate here and set the key name */
		*dp = 0;
		hdr[i].name = *buf;

		/* Skip all spaces */
		do {
			dp++;
		} while ((*dp == ' ') || (*dp == '\t'));

		/* The rest of the line is the value */
		hdr[i].value = dp;

		/* Find end of line */
		while ((*dp != 0) && (*dp != '\r') && (*dp != '\n')) {
			dp++;
		};

		/* eliminate \r */
		if (*dp == '\r') {
			*dp = 0;
			dp++;
			if (*dp != '\n') {
				/* This is not a valid line. */
				return -1;
			}
		}

		/* here *dp is either 0 or '\n' */
		/* in any case, we have a new header */
		num_headers = i + 1;

		if (*dp) {
			*dp = 0;
			dp++;
			*buf = dp;

			if ((dp[0] == '\r') || (dp[0] == '\n')) {
				/* This is the end of the header */
				break;
			}
		} else {
			*buf = dp;
			break;
		}
	}
	return num_headers;
}